

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctor.hpp
# Opt level: O3

void __thiscall
njoy::ENDFtk::section::Type<12>::Type<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
          (Type<12> *this,HEAD *head,
          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *begin,__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *end,long *lineNumber,int MAT)

{
  double AWR;
  double dVar1;
  int N;
  
  AWR = (head->super_StructureDivision).base.fields.
        super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
        super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.super__Head_base<1UL,_double,_false>.
        _M_head_impl;
  dVar1 = round((head->super_StructureDivision).base.fields.
                super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                super__Head_base<0UL,_double,_false>._M_head_impl);
  N = 0x127150;
  Base::Base(&this->super_Base,(int)dVar1,AWR,
             (head->super_StructureDivision).tail.fields._M_elems[2]);
  readPhotonProduction<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
            (&this->photon_,(Type<12> *)begin,end,
             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)lineNumber,(long *)(ulong)(uint)MAT,0xc,
             (head->super_StructureDivision).tail.fields._M_elems[2],
             (int)(head->super_StructureDivision).base.fields.
                  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>.
                  _M_head_impl,
             (int)((_Head_base<4UL,_long,_false> *)
                  ((long)&(head->super_StructureDivision).base.fields.
                          super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                          super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                          super__Tuple_impl<2UL,_long,_long,_long,_long>.
                          super__Tuple_impl<3UL,_long,_long,_long> + 8))->_M_head_impl,N);
  BaseWithoutMT<njoy::ENDFtk::section::Base>::
  readSEND<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>(begin,end,lineNumber,MAT,0xc);
  return;
}

Assistant:

Type( HEAD& head,
      Iterator& begin,
      const Iterator& end,
      long& lineNumber,
      int MAT )
  try : Base( head.ZA(), head.AWR(), head.MT() ),
        photon_( readPhotonProduction( begin, end, lineNumber,
                                       MAT, 12, head.MT(),
                                       head.L1(), head.N1() ) ) {
    readSEND( begin, end, lineNumber, MAT, 12 );
  } catch ( std::exception& e ) {
    Log::info( "Trouble while reading section {} of File 12 of Material {}",
               head.MT(), MAT );
    throw e;
  }